

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# safe_list.h
# Opt level: O0

bool __thiscall
obs::safe_list<obs::slot<int_()>_>::iterator::operator!=(iterator *this,iterator *other)

{
  lock_guard<std::mutex> local_28;
  lock_guard<std::mutex> l;
  iterator *other_local;
  iterator *this_local;
  
  l._M_device = (mutex_type *)other;
  std::lock_guard<std::mutex>::lock_guard(&local_28,&this->m_list->m_mutex_nodes);
  if ((this->m_node == (node *)0x0) ||
     (*(long *)((long)&((l._M_device)->super___mutex_base)._M_mutex + 8) == 0)) {
    this_local._7_1_ = false;
  }
  else {
    this_local._7_1_ =
         this->m_node !=
         *(node **)(*(long *)((long)&((l._M_device)->super___mutex_base)._M_mutex + 8) + 0x10);
  }
  std::lock_guard<std::mutex>::~lock_guard(&local_28);
  return this_local._7_1_;
}

Assistant:

bool operator!=(const iterator& other) const {
      std::lock_guard<std::mutex> l(m_list.m_mutex_nodes);
      if (m_node && other.m_node)
        return (m_node != other.m_node->next);
      else
        return false;
    }